

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O3

int floatx80_unordered_quiet_ppc64(floatx80 a,floatx80 b,float_status *status)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  
  uVar3 = a.high & 0x7fff;
  if (((-1 < (long)a.low &&
        ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) ||
      (uVar2 = b.high & 0x7fff,
      -1 < (long)b.low && ((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
      ) || (((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0
              && uVar3 == 0x7fff ||
             (iVar1 = 0,
             ((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0
             && uVar2 == 0x7fff)) &&
            ((((uVar3 == 0x7fff &&
               (((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                (undefined1  [16])0x0)) &&
              (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0
              )) || (((iVar1 = 1, uVar2 == 0x7fff &&
                      (((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                       (undefined1  [16])0x0)) &&
                     (((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                      (undefined1  [16])0x0)))))))) {
    status->float_exception_flags = status->float_exception_flags | 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}